

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

char * lj_str_find(char *s,char *p,MSize slen,MSize plen)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char *q;
  int c;
  MSize plen_local;
  MSize slen_local;
  char *p_local;
  char *s_local;
  
  if (plen <= slen) {
    if (plen == 0) {
      return s;
    }
    bVar1 = *p;
    c = slen - (plen - 1);
    p_local = s;
    while ((c != 0 &&
           (pcVar3 = (char *)memchr(p_local,(uint)bVar1,(ulong)(uint)c), pcVar3 != (char *)0x0))) {
      iVar2 = memcmp(pcVar3 + 1,p + 1,(ulong)(plen - 1));
      if (iVar2 == 0) {
        return pcVar3;
      }
      c = c - ((int)(pcVar3 + 1) - (int)p_local);
      p_local = pcVar3 + 1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_str_find(const char *s, const char *p, MSize slen, MSize plen)
{
  if (plen <= slen) {
    if (plen == 0) {
      return s;
    } else {
      int c = *(const uint8_t *)p++;
      plen--; slen -= plen;
      while (slen) {
	const char *q = (const char *)memchr(s, c, slen);
	if (!q) break;
	if (memcmp(q+1, p, plen) == 0) return q;
	q++; slen -= (MSize)(q-s); s = q;
      }
    }
  }
  return NULL;
}